

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

uint * __thiscall
Lib::Map<Kernel::Variable,_unsigned_int,_Lib::StlHash>::insert
          (Map<Kernel::Variable,_unsigned_int,_Lib::StlHash> *this,SymbolId *key,uint *val,uint code
          )

{
  bool bVar1;
  uint *puVar2;
  uint in_ECX;
  uint *in_RSI;
  Map<Kernel::Variable,_unsigned_int,_Lib::StlHash> *in_RDI;
  Entry *entry;
  SymbolId *in_stack_ffffffffffffffb8;
  Entry *local_30;
  
  local_30 = firstEntryForCode(in_RDI,in_ECX);
  do {
    bVar1 = Entry::occupied(local_30);
    if (!bVar1) {
      in_RDI->_noOfEntries = in_RDI->_noOfEntries + 1;
      Entry::init(local_30,(EVP_PKEY_CTX *)(ulong)*in_RSI);
      puVar2 = Entry::value(local_30);
      return puVar2;
    }
    if (local_30->code == in_ECX) {
      Entry::key(local_30);
      bVar1 = StlHash::equals<Kernel::Variable>((SymbolId *)in_RDI,in_stack_ffffffffffffffb8);
      if (bVar1) {
        puVar2 = Entry::value(local_30);
        return puVar2;
      }
    }
    local_30 = nextEntry(in_RDI,local_30);
  } while( true );
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }